

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

void __thiscall
Js::DynamicProfileInfo::RecordFieldAccess
          (DynamicProfileInfo *this,FunctionBody *functionBody,uint fieldAccessId,Var object,
          FldInfoFlags flags)

{
  FldInfoFlags oldFlags_00;
  code *pcVar1;
  bool bVar2;
  FldInfoFlags FVar3;
  ValueType VVar4;
  uint uVar5;
  undefined4 *puVar6;
  FldInfo **ppFVar7;
  FldInfoFlags mergedFlags;
  FldInfoFlags oldFlags;
  FldInfoFlags flags_local;
  Var object_local;
  uint fieldAccessId_local;
  FunctionBody *functionBody_local;
  DynamicProfileInfo *this_local;
  
  uVar5 = FunctionBody::GetProfiledFldCount(functionBody);
  if (uVar5 <= fieldAccessId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x4ed,"(fieldAccessId < functionBody->GetProfiledFldCount())",
                                "fieldAccessId < functionBody->GetProfiledFldCount()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ppFVar7 = Memory::WriteBarrierPtr::operator_cast_to_FldInfo__((WriteBarrierPtr *)&this->fldInfo);
  oldFlags_00 = (*ppFVar7)[fieldAccessId].flags;
  if (object != (Var)0x0) {
    ppFVar7 = Memory::WriteBarrierPtr::operator_cast_to_FldInfo__((WriteBarrierPtr *)&this->fldInfo)
    ;
    VVar4 = ValueType::Merge(&(*ppFVar7)[fieldAccessId].valueType,object);
    ppFVar7 = Memory::WriteBarrierPtr::operator_cast_to_FldInfo__((WriteBarrierPtr *)&this->fldInfo)
    ;
    ((anon_union_2_4_ea848c7b_for_ValueType_13 *)(*ppFVar7 + fieldAccessId))->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar4.field_0;
  }
  FVar3 = MergeFldInfoFlags(oldFlags_00,flags);
  ppFVar7 = Memory::WriteBarrierPtr::operator_cast_to_FldInfo__((WriteBarrierPtr *)&this->fldInfo);
  (*ppFVar7)[fieldAccessId].flags = FVar3;
  if ((flags & FldInfo_Polymorphic) == FldInfo_NoInfo) {
    if ((flags != FldInfo_NoInfo) &&
       (ppFVar7 = Memory::WriteBarrierPtr::operator_cast_to_FldInfo__
                            ((WriteBarrierPtr *)&this->fldInfo),
       (*ppFVar7)[fieldAccessId].polymorphicInlineCacheUtilization != 0xff)) {
      ppFVar7 = Memory::WriteBarrierPtr::operator_cast_to_FldInfo__
                          ((WriteBarrierPtr *)&this->fldInfo);
      if ((*ppFVar7)[fieldAccessId].polymorphicInlineCacheUtilization < 2) {
        ppFVar7 = Memory::WriteBarrierPtr::operator_cast_to_FldInfo__
                            ((WriteBarrierPtr *)&this->fldInfo);
        (*ppFVar7)[fieldAccessId].polymorphicInlineCacheUtilization = '\0';
      }
      else {
        ppFVar7 = Memory::WriteBarrierPtr::operator_cast_to_FldInfo__
                            ((WriteBarrierPtr *)&this->fldInfo);
        (*ppFVar7)[fieldAccessId].polymorphicInlineCacheUtilization =
             (*ppFVar7)[fieldAccessId].polymorphicInlineCacheUtilization + 0xff;
      }
    }
  }
  else {
    *(uint *)&this->bits = *(uint *)&this->bits & 0xfbffffff | 0x4000000;
    if ((oldFlags_00 & FldInfo_Polymorphic) == FldInfo_NoInfo) {
      SetHasNewPolyFieldAccess(this,functionBody);
    }
    ppFVar7 = Memory::WriteBarrierPtr::operator_cast_to_FldInfo__((WriteBarrierPtr *)&this->fldInfo)
    ;
    if ((*ppFVar7)[fieldAccessId].polymorphicInlineCacheUtilization < 0xf5) {
      ppFVar7 = Memory::WriteBarrierPtr::operator_cast_to_FldInfo__
                          ((WriteBarrierPtr *)&this->fldInfo);
      (*ppFVar7)[fieldAccessId].polymorphicInlineCacheUtilization =
           (*ppFVar7)[fieldAccessId].polymorphicInlineCacheUtilization + '\n';
    }
    else {
      ppFVar7 = Memory::WriteBarrierPtr::operator_cast_to_FldInfo__
                          ((WriteBarrierPtr *)&this->fldInfo);
      (*ppFVar7)[fieldAccessId].polymorphicInlineCacheUtilization = 0xff;
    }
  }
  return;
}

Assistant:

void DynamicProfileInfo::RecordFieldAccess(FunctionBody* functionBody, uint fieldAccessId, Var object, FldInfoFlags flags)
    {
        Assert(fieldAccessId < functionBody->GetProfiledFldCount());
        FldInfoFlags oldFlags = fldInfo[fieldAccessId].flags;
        if (object) // if not provided, the saved value type is not changed
        {
            fldInfo[fieldAccessId].valueType = fldInfo[fieldAccessId].valueType.Merge(object);
        }
        const auto mergedFlags = MergeFldInfoFlags(oldFlags, flags);
        fldInfo[fieldAccessId].flags = mergedFlags;
        if (flags & FldInfo_Polymorphic)
        {
            bits.hasPolymorphicFldAccess = true;
            if (!(oldFlags & FldInfo_Polymorphic))
            {
                this->SetHasNewPolyFieldAccess(functionBody);
            }
            if (fldInfo[fieldAccessId].polymorphicInlineCacheUtilization < (PolymorphicInlineCacheUtilizationMaxValue - PolymorphicInlineCacheUtilizationIncrement))
            {
                fldInfo[fieldAccessId].polymorphicInlineCacheUtilization += PolymorphicInlineCacheUtilizationIncrement;
            }
            else
            {
                fldInfo[fieldAccessId].polymorphicInlineCacheUtilization = PolymorphicInlineCacheUtilizationMaxValue;
            }
        }
        else if (flags != FldInfo_NoInfo &&
            fldInfo[fieldAccessId].polymorphicInlineCacheUtilization != PolymorphicInlineCacheUtilizationMaxValue)
        {
            if (fldInfo[fieldAccessId].polymorphicInlineCacheUtilization > (PolymorphicInlineCacheUtilizationMinValue + PolymorphicInlineCacheUtilizationDecrement))
            {
                fldInfo[fieldAccessId].polymorphicInlineCacheUtilization -= PolymorphicInlineCacheUtilizationDecrement;
            }
            else
            {
                fldInfo[fieldAccessId].polymorphicInlineCacheUtilization = PolymorphicInlineCacheUtilizationMinValue;
            }
        }
    }